

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testNetworkAdapterList(void)

{
  ushort uVar1;
  char *pcVar2;
  NetworkAdapterAddress *address;
  NetworkAdapterDesc *pNVar3;
  NetworkAdapterAddress *pNVar4;
  C *pCVar5;
  undefined1 *puVar6;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_a0;
  NetworkAdapterDesc *local_80;
  List<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  adapterList;
  SockAddr netMask;
  
  puts("Enumerating adapters...");
  adapterList.
  super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  .
  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  .super_ListData<axl::io::NetworkAdapterDesc>.m_head = (NetworkAdapterDesc *)0x0;
  adapterList.
  super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  .
  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  .super_ListData<axl::io::NetworkAdapterDesc>.m_tail = (NetworkAdapterDesc *)0x0;
  adapterList.
  super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  .
  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
  .super_ListData<axl::io::NetworkAdapterDesc>.m_count = 0;
  axl::io::enumerateNetworkAdapters(&adapterList);
  printf("%d adapters found.\n",
         adapterList.
         super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
         .
         super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
         .super_ListData<axl::io::NetworkAdapterDesc>.m_count);
  pNVar3 = (NetworkAdapterDesc *)&adapterList;
  while (pNVar3 = (((OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
                     *)&pNVar3->super_ListLink)->
                  super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
                  ).super_ListData<axl::io::NetworkAdapterDesc>.m_head,
        pNVar3 != (NetworkAdapterDesc *)0x0) {
    pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if ((pNVar3->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_length != 0)
    {
      pCVar5 = (pNVar3->m_name).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p;
    }
    printf("Name        = %s\n",pCVar5);
    puVar6 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if ((pNVar3->m_description).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
        m_length != 0) {
      puVar6 = (pNVar3->m_description).super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.
               m_p;
    }
    printf("Description = %s\n",puVar6);
    pcVar2 = axl::io::getNetworkAdapterTypeString(pNVar3->m_type);
    printf("Type        = %s\n",pcVar2);
    axl::io::getNetworkAdapterFlagString((String *)&local_a0,pNVar3->m_flags);
    pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_a0.m_length != 0) {
      pCVar5 = local_a0.m_p;
    }
    printf("Flags       = %s\n",pCVar5);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_a0);
    axl::io::getMacAddressString((String *)&local_a0,pNVar3->m_macAddress,0);
    pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
    if (local_a0.m_length != 0) {
      pCVar5 = local_a0.m_p;
    }
    printf("Mac         = %s\n",pCVar5);
    axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_a0);
    pNVar4 = (NetworkAdapterAddress *)&pNVar3->m_addressList;
    local_80 = pNVar3;
    while (pNVar4 = (((OwningListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterAddress>_>
                       *)&pNVar4->super_ListLink)->
                    super_ListBase<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterAddress,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterAddress,_axl::sl::ListLink>_>_>
                    ).super_ListData<axl::io::NetworkAdapterAddress>.m_head,
          pNVar4 != (NetworkAdapterAddress *)0x0) {
      uVar1 = (pNVar4->m_address).field_0.m_addr.sa_family;
      pcVar2 = axl::io::getSockAddrFamilyString((uint)uVar1);
      axl::io::getSockAddrString((String *)&local_a0,(sockaddr *)&pNVar4->m_address);
      pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
      if (local_a0.m_length != 0) {
        pCVar5 = local_a0.m_p;
      }
      printf("%-11s = %s",pcVar2,pCVar5);
      axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_a0);
      if (uVar1 == 2) {
        netMask.field_0._16_4_ = 0;
        netMask.field_0._20_8_ = 0;
        netMask.field_0._0_8_ = 0;
        netMask.field_0._8_4_ = 0;
        netMask.field_0._12_4_ = 0;
        axl::io::createSockAddrNetMask_ip4((sockaddr_in *)&netMask,pNVar4->m_netMaskBitCount);
        axl::io::getSockAddrString((String *)&local_a0,(sockaddr *)&netMask);
        pCVar5 = &axl::sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
        if (local_a0.m_length != 0) {
          pCVar5 = local_a0.m_p;
        }
        printf(" (mask %s)\n",pCVar5);
        axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase(&local_a0);
      }
      else {
        printf("/%d\n",pNVar4->m_netMaskBitCount);
      }
    }
    putchar(10);
    pNVar3 = local_80;
  }
  printf("%d adapters found\n",
         adapterList.
         super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
         .
         super_ListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>_>
         .super_ListData<axl::io::NetworkAdapterDesc>.m_count);
  axl::sl::
  OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
  ::~OwningListBase(&adapterList.
                     super_OwningListBase<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::NetworkAdapterDesc,_axl::sl::ImplicitPtrCast<axl::io::NetworkAdapterDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::NetworkAdapterDesc>_>
                   );
  return;
}

Assistant:

void
testNetworkAdapterList() {
	printf("Enumerating adapters...\n");

	sl::List<io::NetworkAdapterDesc> adapterList;
	io::enumerateNetworkAdapters(&adapterList);

	printf("%d adapters found.\n", adapterList.getCount());

	sl::Iterator<io::NetworkAdapterDesc> adapterIt = adapterList.getHead();
	for (; adapterIt; adapterIt++) {
		io::NetworkAdapterDesc* adapter = *adapterIt;

		printf("Name        = %s\n", adapter->m_name.sz());
		printf("Description = %s\n", adapter->m_description.sz());
		printf("Type        = %s\n", io::getNetworkAdapterTypeString(adapter->m_type));
		printf("Flags       = %s\n", io::getNetworkAdapterFlagString(adapter->m_flags).sz());
		printf("Mac         = %s\n", io::getMacAddressString(adapter->m_macAddress).sz());

		sl::ConstList<io::NetworkAdapterAddress> addressList = adapter->m_addressList;
		sl::ConstIterator<io::NetworkAdapterAddress> addressIt = addressList.getHead();
		for (size_t i = 1; addressIt; addressIt++, i++) {
			const io::NetworkAdapterAddress* address = *addressIt;

			uint_t family = address->m_address.m_addr.sa_family;
			printf("%-11s = %s",
				io::getSockAddrFamilyString(family),
				address->m_address.getString().sz()
			);

			if (family == AF_INET) {
				io::SockAddr netMask;
				netMask.createNetMask_ip4(address->m_netMaskBitCount);
				printf(" (mask %s)\n", netMask.getString().sz());
			} else {
				printf("/%d\n", address->m_netMaskBitCount);
			}
		}

		printf("\n");
	}

	printf("%d adapters found\n", adapterList.getCount());
}